

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O3

void __thiscall VkSpecParser::parseFeature(VkSpecParser *this)

{
  long lVar1;
  qsizetype qVar2;
  char16_t *pcVar3;
  char cVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  iterator iVar8;
  iterator iVar9;
  QArrayData *pQVar10;
  QXmlStreamAttribute *attr;
  long in_FS_OFFSET;
  QStringView QVar11;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  undefined1 auVar20 [16];
  QString local_c0;
  QString local_a8;
  QArrayDataPointer<QXmlStreamAttribute> local_90;
  QString local_78;
  QArrayData *local_58;
  char16_t *pcStack_50;
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 0;
  local_58 = (QArrayData *)0x0;
  pcStack_50 = (char16_t *)0x0;
  local_78.d.size = 0;
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (char16_t *)0x0;
  QXmlStreamReader::attributes();
  iVar8 = QList<QXmlStreamAttribute>::begin((QList<QXmlStreamAttribute> *)&local_90);
  iVar9 = QList<QXmlStreamAttribute>::end((QList<QXmlStreamAttribute> *)&local_90);
  if (iVar8.i != iVar9.i) {
    do {
      lVar1 = ((iVar8.i)->m_name).m_string.size;
      if (lVar1 == 4) {
        QVar12.m_data = ((iVar8.i)->m_name).m_string.ptr;
        QVar12.m_size = 4;
        QVar16.m_data = L"name";
        QVar16.m_size = 4;
        cVar4 = QtPrivate::equalStrings(QVar12,QVar16);
        if (cVar4 != '\0') {
          QString::QString(&local_c0,(QChar *)((iVar8.i)->m_value).m_string.ptr,
                           ((iVar8.i)->m_value).m_string.size);
          QString::trimmed_helper(&local_a8);
          pcVar3 = local_78.d.ptr;
          pQVar10 = &(local_78.d.d)->super_QArrayData;
          qVar2 = local_a8.d.size;
          local_78.d.d = local_a8.d.d;
          local_78.d.ptr = local_a8.d.ptr;
          local_a8.d.ptr = pcVar3;
          local_a8.d.size = local_78.d.size;
          local_78.d.size = qVar2;
LAB_001031eb:
          local_a8.d.d = (Data *)pQVar10;
          if (pQVar10 != (QArrayData *)0x0) {
            LOCK();
            (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar10->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar10,2,0x10);
            }
          }
          if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
      }
      else if (lVar1 == 3) {
        QVar11.m_data = ((iVar8.i)->m_name).m_string.ptr;
        QVar11.m_size = 3;
        QVar15.m_data = L"api";
        QVar15.m_size = 3;
        cVar4 = QtPrivate::equalStrings(QVar11,QVar15);
        if (cVar4 != '\0') {
          QString::QString(&local_c0,(QChar *)((iVar8.i)->m_value).m_string.ptr,
                           ((iVar8.i)->m_value).m_string.size);
          QString::trimmed_helper(&local_a8);
          pcVar3 = pcStack_50;
          pQVar10 = local_58;
          qVar2 = local_a8.d.size;
          local_58 = &(local_a8.d.d)->super_QArrayData;
          pcStack_50 = local_a8.d.ptr;
          local_a8.d.ptr = pcVar3;
          local_a8.d.size = local_48;
          local_48 = qVar2;
          goto LAB_001031eb;
        }
      }
      iVar8.i = iVar8.i + 1;
    } while (iVar8.i != iVar9.i);
  }
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_90);
  QString::split(&local_90,&local_58,0x2c,0,1);
  QVar19.m_data = L"vulkan";
  QVar19.m_size = 6;
  bVar5 = QtPrivate::QStringList_contains((QList *)&local_90,QVar19,CaseSensitive);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_90);
  cVar4 = QXmlStreamReader::atEnd();
  if (cVar4 == '\0') {
    do {
      QXmlStreamReader::readNext();
      iVar7 = QXmlStreamReader::tokenType();
      if (iVar7 == 5) {
        auVar20 = QXmlStreamReader::name();
        if (auVar20._0_8_ == 7) {
          QVar13.m_data = auVar20._8_8_;
          QVar13.m_size = 7;
          QVar17.m_data = L"feature";
          QVar17.m_size = 7;
          cVar4 = QtPrivate::equalStrings(QVar13,QVar17);
          if (cVar4 != '\0') break;
        }
      }
      iVar7 = QXmlStreamReader::tokenType();
      if (iVar7 == 4) {
        auVar20 = QXmlStreamReader::name();
        if (auVar20._0_8_ == 7) {
          QVar14.m_data = auVar20._8_8_;
          QVar14.m_size = 7;
          QVar18.m_data = L"require";
          QVar18.m_size = 7;
          bVar6 = QtPrivate::equalStrings(QVar14,QVar18);
          if ((bVar6 & bVar5) == 1) {
            parseFeatureRequire(this,&local_78);
          }
        }
      }
      cVar4 = QXmlStreamReader::atEnd();
    } while (cVar4 == '\0');
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VkSpecParser::parseFeature()
{
    // <feature api="vulkan" name="VK_VERSION_1_0" number="1.0" comment="Vulkan core API interface definitions">
    //   <require comment="Device initialization">

    QString api;
    QString versionName;
    for (const QXmlStreamAttribute &attr : m_reader.attributes()) {
        if (attr.name() == QStringLiteral("api"))
            api = attr.value().toString().trimmed();
        else if (attr.name() == QStringLiteral("name"))
            versionName = attr.value().toString().trimmed();
    }
    const bool isVulkan = api.split(',').contains(QStringLiteral("vulkan"));

    while (!m_reader.atEnd()) {
        m_reader.readNext();
        if (m_reader.isEndElement() && m_reader.name() == QStringLiteral("feature"))
            return;
        if (m_reader.isStartElement() && m_reader.name() == QStringLiteral("require")) {
            if (isVulkan)
                parseFeatureRequire(versionName);
        }
    }
}